

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_sse_sad(uint16_t *data,uint32_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint32_t buffer [16];
  undefined1 auVar16 [16];
  
  auVar16[8] = 0x41;
  auVar16._0_8_ = 0x4141414141414141;
  auVar16[9] = 0x41;
  auVar16[10] = 0x41;
  auVar16[0xb] = 0x41;
  auVar16[0xc] = 0x41;
  auVar16[0xd] = 0x41;
  auVar16[0xe] = 0x41;
  auVar16[0xf] = 0x41;
  auVar18._8_4_ = 0x3f003f;
  auVar18._0_8_ = 0x3f003f003f003f;
  auVar18._12_4_ = 0x3f003f;
  auVar30[8] = 0x82;
  auVar30._0_8_ = 0x8282828282828282;
  auVar30[9] = 0x82;
  auVar30[10] = 0x82;
  auVar30[0xb] = 0x82;
  auVar30[0xc] = 0x82;
  auVar30[0xd] = 0x82;
  auVar30[0xe] = 0x82;
  auVar30[0xf] = 0x82;
  auVar26 = ZEXT1664((undefined1  [16])0x0);
  auVar29 = ZEXT1664((undefined1  [16])0x0);
  auVar32 = ZEXT1664((undefined1  [16])0x0);
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  lVar9 = (ulong)(len >> 5) << 6;
  pauVar11 = (undefined1 (*) [16])data;
  while( true ) {
    auVar17 = auVar26._0_16_;
    auVar24 = auVar29._0_16_;
    auVar27 = auVar32._0_16_;
    auVar33 = auVar34._0_16_;
    if (lVar9 == 0) break;
    auVar4 = *pauVar11;
    pauVar1 = pauVar11 + 1;
    pauVar2 = pauVar11 + 2;
    pauVar3 = pauVar11 + 3;
    pauVar11 = pauVar11 + 4;
    lVar9 = lVar9 + -0x40;
    auVar7 = vpshufb_avx(auVar4,_DAT_0010f010);
    auVar13 = vpshufb_avx(*pauVar1,_DAT_0010f010);
    auVar12 = vpshufb_avx(*pauVar3,_DAT_0010f010);
    auVar15 = vpshufb_avx(*pauVar2,_DAT_0010f010);
    auVar4 = vpand_avx(auVar7,auVar16);
    auVar36 = vpand_avx(auVar13,auVar16);
    auVar37 = vpand_avx(auVar12,auVar16);
    auVar4 = vpsadbw_avx(auVar4,(undefined1  [16])0x0);
    auVar36 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
    auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
    auVar4 = vpaddw_avx(auVar36,auVar4);
    auVar36 = vpand_avx(auVar15,auVar16);
    auVar36 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
    auVar36 = vpaddw_avx(auVar36,auVar37);
    auVar37 = vpand_avx(auVar12,auVar30);
    auVar12 = vpshldw_avx512_vbmi2(auVar12,auVar12,0xc);
    auVar4 = vpaddw_avx(auVar4,auVar36);
    auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
    auVar36 = vpsrlw_avx(auVar4,6);
    auVar4 = vpand_avx(auVar4,auVar18);
    auVar4 = vpackssdw_avx(auVar36,auVar4);
    auVar36 = vpand_avx(auVar13,auVar30);
    auVar13 = vpshldw_avx512_vbmi2(auVar13,auVar13,0xc);
    auVar36 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
    auVar33 = vpaddd_avx(auVar33,auVar4);
    auVar34 = ZEXT1664(auVar33);
    auVar33 = vpand_avx(auVar7,auVar30);
    auVar14 = vpshldw_avx512_vbmi2(auVar7,auVar7,0xc);
    auVar33 = vpsadbw_avx(auVar33,(undefined1  [16])0x0);
    auVar33 = vpaddw_avx(auVar36,auVar33);
    auVar4 = vpand_avx(auVar15,auVar30);
    auVar15 = vpshldw_avx512_vbmi2(auVar15,auVar15,0xc);
    auVar4 = vpsadbw_avx(auVar4,(undefined1  [16])0x0);
    auVar4 = vpaddw_avx(auVar4,auVar37);
    auVar36 = vpand_avx(auVar12,auVar16);
    auVar33 = vpaddw_avx(auVar33,auVar4);
    auVar7 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
    auVar4 = vpavgb_avx(auVar33,(undefined1  [16])0x0);
    auVar36 = vpsrlw_avx(auVar33,7);
    auVar33 = vpand_avx(auVar4,auVar18);
    auVar33 = vpackssdw_avx(auVar36,auVar33);
    auVar4 = vpand_avx(auVar13,auVar16);
    auVar36 = vpand_avx(auVar13,auVar30);
    auVar4 = vpsadbw_avx(auVar4,(undefined1  [16])0x0);
    auVar36 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
    auVar27 = vpaddd_avx(auVar33,auVar27);
    auVar32 = ZEXT1664(auVar27);
    auVar27 = vpand_avx(auVar14,auVar16);
    auVar33 = vpand_avx(auVar14,auVar30);
    auVar27 = vpsadbw_avx(auVar27,(undefined1  [16])0x0);
    auVar33 = vpsadbw_avx(auVar33,(undefined1  [16])0x0);
    auVar27 = vpaddw_avx(auVar4,auVar27);
    auVar4 = vpand_avx(auVar15,auVar16);
    auVar33 = vpaddw_avx(auVar36,auVar33);
    auVar36 = vpand_avx(auVar15,auVar30);
    auVar37 = vpand_avx(auVar12,auVar30);
    auVar36 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
    auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
    auVar13 = vpsadbw_avx(auVar4,(undefined1  [16])0x0);
    auVar4 = vpaddw_avx(auVar36,auVar37);
    auVar36 = vpaddw_avx(auVar13,auVar7);
    auVar33 = vpaddw_avx(auVar33,auVar4);
    auVar27 = vpaddw_avx(auVar27,auVar36);
    auVar4 = vpavgb_avx(auVar33,(undefined1  [16])0x0);
    auVar37 = vpsrlw_avx(auVar27,6);
    auVar27 = vpand_avx(auVar27,auVar18);
    auVar36 = vpsrlw_avx(auVar33,7);
    auVar27 = vpackssdw_avx(auVar37,auVar27);
    auVar33 = vpand_avx(auVar4,auVar18);
    auVar33 = vpackssdw_avx(auVar36,auVar33);
    auVar24 = vpaddd_avx(auVar27,auVar24);
    auVar29 = ZEXT1664(auVar24);
    auVar17 = vpaddd_avx(auVar33,auVar17);
    auVar26 = ZEXT1664(auVar17);
  }
  auVar4 = vpunpckldq_avx(auVar24,auVar17);
  auVar16 = vpunpckhdq_avx(auVar33,auVar27);
  auVar27 = vpunpckldq_avx(auVar33,auVar27);
  auVar18 = vpunpckhdq_avx(auVar24,auVar17);
  lVar9 = 0;
  auVar30 = vpunpckhqdq_avx(auVar16,auVar4);
  auVar17 = vpunpckhqdq_avx(auVar18,auVar27);
  auVar18 = vpunpcklqdq_avx(auVar18,auVar27);
  auVar16 = vpunpcklqdq_avx(auVar16,auVar4);
  buffer[0] = auVar30._0_4_;
  buffer[1] = auVar30._4_4_;
  buffer[2] = auVar30._8_4_;
  buffer[3] = auVar30._12_4_;
  buffer[4] = auVar17._0_4_;
  buffer[5] = auVar17._4_4_;
  buffer[6] = auVar17._8_4_;
  buffer[7] = auVar17._12_4_;
  buffer[8] = auVar16._0_4_;
  buffer[9] = auVar16._4_4_;
  buffer[10] = auVar16._8_4_;
  buffer[0xb] = auVar16._12_4_;
  buffer[0xc] = auVar18._0_4_;
  buffer[0xd] = auVar18._4_4_;
  buffer[0xe] = auVar18._8_4_;
  buffer[0xf] = auVar18._12_4_;
  for (; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    flag_counts[lVar9] = flag_counts[lVar9] + buffer[lVar9];
  }
  if ((len & 0x1f) != 0) {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vpbroadcastq_avx512f(ZEXT816(0x5555));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(0x40010004001));
    auVar34 = vpbroadcastq_avx512f(ZEXT816(0x101010101010101));
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = vpbroadcastq_avx512f();
    uVar10 = 0;
    do {
      auVar21 = vmovdqa64_avx512f(auVar35);
      auVar35 = vpbroadcastq_avx512f();
      auVar22 = vmovdqa64_avx512f(auVar31);
      auVar31 = vporq_avx512f(auVar35,auVar26);
      uVar8 = vpcmpuq_avx512f(auVar31,auVar20,2);
      auVar16 = vmovdqu16_avx512vl(*(undefined1 (*) [16])(data + (len & 0xffffffe0) + uVar10));
      bVar5 = (byte)uVar8;
      auVar17._2_2_ = (ushort)((byte)(uVar8 >> 1) & 1) * auVar16._2_2_;
      auVar17._0_2_ = (ushort)(bVar5 & 1) * auVar16._0_2_;
      auVar17._4_2_ = (ushort)((byte)(uVar8 >> 2) & 1) * auVar16._4_2_;
      auVar17._6_2_ = (ushort)((byte)(uVar8 >> 3) & 1) * auVar16._6_2_;
      auVar17._8_2_ = (ushort)((byte)(uVar8 >> 4) & 1) * auVar16._8_2_;
      auVar17._10_2_ = (ushort)((byte)(uVar8 >> 5) & 1) * auVar16._10_2_;
      auVar17._12_2_ = (ushort)((byte)(uVar8 >> 6) & 1) * auVar16._12_2_;
      auVar17._14_2_ = (ushort)(byte)(uVar8 >> 7) * auVar16._14_2_;
      uVar10 = uVar10 + 8;
      auVar31 = vpmovzxwq_avx512f(auVar17);
      auVar35 = vpandq_avx512f(auVar31,auVar29);
      auVar31 = vpsrlq_avx512f(auVar31,1);
      auVar31 = vpandq_avx512f(auVar31,auVar29);
      auVar35 = vpmullq_avx512dq(auVar35,auVar32);
      auVar31 = vpmullq_avx512dq(auVar31,auVar32);
      auVar35 = vpandq_avx512f(auVar35,auVar34);
      auVar23 = vpandq_avx512f(auVar31,auVar34);
      auVar31 = vpaddq_avx512f(auVar35,auVar22);
      auVar35 = vpaddq_avx512f(auVar23,auVar21);
    } while (((len & 0x1f) + 7 & 0xfffffff8) != uVar10);
    auVar29 = vmovdqa64_avx512f(auVar31);
    auVar26._0_8_ = (ulong)(bVar5 & 1) * auVar29._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar22._0_8_;
    bVar6 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar26._8_8_ = (ulong)bVar6 * auVar29._8_8_ | (ulong)!bVar6 * auVar22._8_8_;
    bVar6 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar26._16_8_ = (ulong)bVar6 * auVar29._16_8_ | (ulong)!bVar6 * auVar22._16_8_;
    bVar6 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar26._24_8_ = (ulong)bVar6 * auVar29._24_8_ | (ulong)!bVar6 * auVar22._24_8_;
    bVar6 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar26._32_8_ = (ulong)bVar6 * auVar29._32_8_ | (ulong)!bVar6 * auVar22._32_8_;
    bVar6 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar26._40_8_ = (ulong)bVar6 * auVar29._40_8_ | (ulong)!bVar6 * auVar22._40_8_;
    bVar6 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar26._48_8_ = (ulong)bVar6 * auVar29._48_8_ | (ulong)!bVar6 * auVar22._48_8_;
    auVar26._56_8_ = (uVar8 >> 7) * auVar29._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar22._56_8_;
    auVar19 = vextracti64x4_avx512f(auVar26,1);
    auVar32 = vmovdqa64_avx512f(auVar35);
    auVar29._0_8_ = (ulong)(bVar5 & 1) * auVar32._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar21._0_8_;
    bVar6 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar29._8_8_ = (ulong)bVar6 * auVar32._8_8_ | (ulong)!bVar6 * auVar21._8_8_;
    bVar6 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar29._16_8_ = (ulong)bVar6 * auVar32._16_8_ | (ulong)!bVar6 * auVar21._16_8_;
    bVar6 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar29._24_8_ = (ulong)bVar6 * auVar32._24_8_ | (ulong)!bVar6 * auVar21._24_8_;
    bVar6 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar29._32_8_ = (ulong)bVar6 * auVar32._32_8_ | (ulong)!bVar6 * auVar21._32_8_;
    bVar6 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar29._40_8_ = (ulong)bVar6 * auVar32._40_8_ | (ulong)!bVar6 * auVar21._40_8_;
    bVar6 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar29._48_8_ = (ulong)bVar6 * auVar32._48_8_ | (ulong)!bVar6 * auVar21._48_8_;
    auVar29._56_8_ = (uVar8 >> 7) * auVar32._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar21._56_8_;
    auVar26 = vpaddq_avx512f(auVar26,ZEXT3264(auVar19));
    auVar16 = vpaddq_avx(auVar26._0_16_,auVar26._16_16_);
    auVar18 = vpshufd_avx(auVar16,0xee);
    auVar16 = vpaddq_avx(auVar16,auVar18);
    auVar19 = vextracti64x4_avx512f(auVar29,1);
    auVar26 = vpaddq_avx512f(auVar29,ZEXT3264(auVar19));
    auVar18 = vpaddq_avx(auVar26._0_16_,auVar26._16_16_);
    auVar30 = vpshufd_avx(auVar18,0xee);
    auVar18 = vpaddq_avx(auVar18,auVar30);
    auVar17 = vpunpckldq_avx(auVar16,auVar18);
    auVar24 = vpunpcklqdq_avx(auVar16,auVar18);
    auVar30 = vpshufb_avx(auVar24,_DAT_0010f030);
    auVar28._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar24;
    auVar28._16_16_ = ZEXT116(1) * auVar24;
    auVar19 = vpsrlvq_avx2(auVar28,_DAT_0010f9a0);
    auVar27 = vpsrld_avx(auVar17,8);
    auVar17 = vpshufb_avx(auVar17,_DAT_0010f040);
    auVar24 = vpsrlq_avx(auVar24,0x38);
    auVar16 = vpinsrd_avx(auVar27,auVar16._0_4_,2);
    auVar16 = vpinsrd_avx(auVar16,auVar18._0_4_,3);
    auVar16 = vpshufb_avx(auVar16,_DAT_0010f020);
    auVar18 = vpmovqd_avx512vl(auVar19);
    auVar25._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar17;
    auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
    auVar19._8_4_ = 0xff;
    auVar19._0_8_ = 0xff000000ff;
    auVar19._12_4_ = 0xff;
    auVar19._16_4_ = 0xff;
    auVar19._20_4_ = 0xff;
    auVar19._24_4_ = 0xff;
    auVar19._28_4_ = 0xff;
    auVar19 = vpandd_avx512vl(auVar25,auVar19);
    auVar26 = vinserti32x4_avx512f(ZEXT3264(auVar19),auVar16,2);
    auVar29 = vpmovsxbd_avx512f(_DAT_0010f050);
    auVar26 = vinserti32x4_avx512f(auVar26,auVar30,3);
    auVar26 = vpermi2d_avx512f(auVar29,auVar26,ZEXT1664(auVar24));
    auVar26 = vpaddd_avx512f(auVar26,*(undefined1 (*) [64])flag_counts);
    auVar26 = vmovdqu64_avx512f(auVar26);
    *(undefined1 (*) [64])flag_counts = auVar26;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_sad(const uint16_t* data, uint32_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();
    const __m128i mask_lo_byte = _mm_srli_epi16(_mm_cmpeq_epi8(zero, zero), 8);
    const __m128i mask_lo_cnt  = _mm_srli_epi16(mask_lo_byte, 2);
    const __m128i mask_bits_a  = _mm_set1_epi8(0x41); // 01000001
    const __m128i mask_bits_b  = _mm_add_epi8(mask_bits_a, mask_bits_a);
    uint32_t buffer[16];

    __m128i counterA = zero;
    __m128i counterB = zero;
    __m128i counterC = zero;
    __m128i counterD = zero;

    for (const uint16_t* end = &data[(len & ~31)]; data != end; data += 32) {
        __m128i r0 = _mm_loadu_si128((__m128i*)&data[0]);
        __m128i r1 = _mm_loadu_si128((__m128i*)&data[8]);
        __m128i r2 = _mm_loadu_si128((__m128i*)&data[16]);
        __m128i r3 = _mm_loadu_si128((__m128i*)&data[24]);
        __m128i r4, r5, r6, r7;

        // seperate LOBYTE and HIBYTE of each WORD
        // (emulate PSHUFB F,D,B,9,7,5,3,1, E,C,A,8,6,4,2,0)
        r4 = _mm_and_si128(mask_lo_byte, r0);
        r5 = _mm_and_si128(mask_lo_byte, r1);
        r6 = _mm_and_si128(mask_lo_byte, r2);
        r7 = _mm_and_si128(mask_lo_byte, r3);
        r0 = _mm_srli_epi16(r0, 8);
        r1 = _mm_srli_epi16(r1, 8);
        r2 = _mm_srli_epi16(r2, 8);
        r3 = _mm_srli_epi16(r3, 8);
        r0 = _mm_packus_epi16(r0, r4);
        r1 = _mm_packus_epi16(r1, r5);
        r2 = _mm_packus_epi16(r2, r6);
        r3 = _mm_packus_epi16(r3, r7);

        // isolate bits to count
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        // horizontal sum of qwords
        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        // sum 6-bit counts
        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        // unpack 6-bit counts to 32-bits
        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        // accumulate
        counterA = _mm_add_epi32(counterA, r4);

        // do it again...
        r4 = _mm_and_si128(mask_bits_b, r0);
        r5 = _mm_and_si128(mask_bits_b, r1);
        r6 = _mm_and_si128(mask_bits_b, r2);
        r7 = _mm_and_si128(mask_bits_b, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_avg_epu8(zero, r4); // shift right 1
        r5 = _mm_and_si128(r5, mask_lo_cnt);
        r4 = _mm_srli_epi16(r4, 7);
        r4 = _mm_packs_epi32(r4, r5);

        counterB = _mm_add_epi32(counterB, r4); // accumulate

        // rotate right 4
        r4 = _mm_slli_epi16(r0, 12);
        r5 = _mm_slli_epi16(r1, 12);
        r6 = _mm_slli_epi16(r2, 12);
        r7 = _mm_slli_epi16(r3, 12);
        r0 = _mm_srli_epi16(r0, 4);
        r1 = _mm_srli_epi16(r1, 4);
        r2 = _mm_srli_epi16(r2, 4);
        r3 = _mm_srli_epi16(r3, 4);
        r0 = _mm_or_si128(r0, r4);
        r1 = _mm_or_si128(r1, r5);
        r2 = _mm_or_si128(r2, r6);
        r3 = _mm_or_si128(r3, r7);

        // do it again...
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        counterC = _mm_add_epi32(counterC, r4); // accumulate

        // do it again...
        r0 = _mm_and_si128(r0, mask_bits_b);
        r1 = _mm_and_si128(r1, mask_bits_b);
        r2 = _mm_and_si128(r2, mask_bits_b);
        r3 = _mm_and_si128(r3, mask_bits_b);

        r0 = _mm_sad_epu8(r0, zero);
        r1 = _mm_sad_epu8(r1, zero);
        r2 = _mm_sad_epu8(r2, zero);
        r3 = _mm_sad_epu8(r3, zero);

        r0 = _mm_add_epi16(r0,r1);
        r0 = _mm_add_epi16(r0,r2);
        r0 = _mm_add_epi16(r0,r3);

        r1 = _mm_avg_epu8(zero, r0);
        r1 = _mm_and_si128(r1, mask_lo_cnt);
        r0 = _mm_srli_epi16(r0, 7);
        r0 = _mm_packs_epi32(r0, r1);

        counterD = _mm_add_epi32(counterD, r0); // accumulate
    }

    // transpose then store counters
    __m128i counter_1098 = _mm_unpackhi_epi32(counterA, counterB);
    __m128i counter_76FE = _mm_unpacklo_epi32(counterA, counterB);
    __m128i counter_32BA = _mm_unpacklo_epi32(counterC, counterD);
    __m128i counter_54DC = _mm_unpackhi_epi32(counterC, counterD);
    __m128i counter_7654 = _mm_unpackhi_epi64(counter_54DC, counter_76FE);
    __m128i counter_FEDC = _mm_unpacklo_epi64(counter_54DC, counter_76FE);
    __m128i counter_3210 = _mm_unpackhi_epi64(counter_1098, counter_32BA);
    __m128i counter_BA98 = _mm_unpacklo_epi64(counter_1098, counter_32BA);

    
    _mm_storeu_si128((__m128i*)&buffer[0], counter_3210);
    _mm_storeu_si128((__m128i*)&buffer[4], counter_7654);
    _mm_storeu_si128((__m128i*)&buffer[8], counter_BA98);
    _mm_storeu_si128((__m128i*)&buffer[12], counter_FEDC);
    for (int i = 0; i < 16; ++i) flag_counts[i] += buffer[i];

    // scalar tail loop
    int tail = len & 31;
    if (tail != 0) {
        uint64_t countsA = 0;
        uint64_t countsB = 0;
        do {
            // zero-extend a bit to 8-bits then accumulate
            // (emulate pdep)
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);// 100000001000000010000000100000001000000010000000100000001
            const uint64_t magic   = UINT64_C(0x0000040010004001);// 000000000000001000000000000010000000000000100000000000001
                                                                  // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *data++;
            countsA += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            countsB += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--tail);

        // transpose then store counters
        flag_counts[0]  += countsA & 0xFF;
        flag_counts[8]  += (countsA >>  8) & 0xFF;
        flag_counts[2]  += (countsA >> 16) & 0xFF;
        flag_counts[10] += (countsA >> 24) & 0xFF;
        flag_counts[4]  += (countsA >> 32) & 0xFF;
        flag_counts[12] += (countsA >> 40) & 0xFF;
        flag_counts[6]  += (countsA >> 48) & 0xFF;
        flag_counts[14] += (countsA >> 56) & 0xFF;
        flag_counts[1]  += countsB & 0xFF;
        flag_counts[9]  += (countsB >>  8) & 0xFF;
        flag_counts[3]  += (countsB >> 16) & 0xFF;
        flag_counts[11] += (countsB >> 24) & 0xFF;
        flag_counts[5]  += (countsB >> 32) & 0xFF;
        flag_counts[13] += (countsB >> 40) & 0xFF;
        flag_counts[7]  += (countsB >> 48) & 0xFF;
        flag_counts[15] += (countsB >> 56) & 0xFF;
    }

    return 0;
}